

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void stb_newell_normal(float *normal,int num_vert,float **vert,int normalize)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  ulong uVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  
  normal[2] = 0.0;
  normal[0] = 0.0;
  normal[1] = 0.0;
  if (0 < num_vert) {
    fVar5 = *normal;
    fVar7 = normal[1];
    fVar8 = normal[2];
    iVar3 = num_vert + -1;
    uVar4 = 0;
    do {
      pfVar1 = vert[iVar3];
      pfVar2 = vert[uVar4];
      fVar5 = fVar5 + (pfVar1[2] + pfVar2[2]) * (pfVar1[1] - pfVar2[1]);
      *normal = fVar5;
      fVar7 = fVar7 + (*pfVar1 + *pfVar2) * (pfVar1[2] - pfVar2[2]);
      normal[1] = fVar7;
      fVar8 = fVar8 + (pfVar1[1] + pfVar2[1]) * (*pfVar1 - *pfVar2);
      normal[2] = fVar8;
      iVar3 = (int)uVar4;
      uVar4 = uVar4 + 1;
    } while ((uint)num_vert != uVar4);
  }
  if (normalize != 0) {
    dVar6 = (double)(normal[2] * normal[2] + *normal * *normal + normal[1] * normal[1]);
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    fVar5 = (float)(1.0 / dVar6);
    *normal = *normal * fVar5;
    normal[1] = normal[1] * fVar5;
    normal[2] = fVar5 * normal[2];
  }
  return;
}

Assistant:

void stb_newell_normal(float *normal, int num_vert, float **vert, int normalize)
{
   int i,j;
   float p;
   normal[0] = normal[1] = normal[2] = 0;
   for (i=num_vert-1,j=0; j < num_vert; i=j++) {
      float *u = vert[i];
      float *v = vert[j];
      normal[0] += (u[1] - v[1]) * (u[2] + v[2]);
      normal[1] += (u[2] - v[2]) * (u[0] + v[0]);
      normal[2] += (u[0] - v[0]) * (u[1] + v[1]);
   }
   if (normalize) {
      p = normal[0]*normal[0] + normal[1]*normal[1] + normal[2]*normal[2];
      p = (float) (1.0 / sqrt(p));
      normal[0] *= p;
      normal[1] *= p;
      normal[2] *= p;
   }
}